

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonschema::
ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
ref_validator(ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *schema,
             uri *schema_location,string *custom_message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffffa8;
  uri *in_stack_ffffffffffffffb0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  void **in_stack_ffffffffffffffc8;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  validator_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  validator_base((validator_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)(in_RDI + 0x1d));
  ref<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::ref
            ((ref<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *)
             (in_RDI + 0x1e));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  keyword_validator((keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
                    ,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  *in_RDI = 0x1349ce8;
  in_RDI[0x1d] = 0x1349d78;
  in_RDI[0x1e] = 0x1349dd0;
  in_RDI[0x1c] = 0;
  return;
}

Assistant:

ref_validator(const Json& schema, const uri& schema_location, const std::string& custom_message = std::string{}) 
            : keyword_validator<Json>("$ref", schema, schema_location, custom_message), referred_schema_{nullptr}
        {
            //std::cout << "ref_validator: " << this->schema_location().string() << "\n";
        }